

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

void embree::avx::ConeCurveMiIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *line)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint uVar27;
  uint uVar28;
  undefined4 uVar29;
  RTCIntersectArguments *pRVar30;
  long lVar32;
  float fVar33;
  float fVar42;
  float fVar43;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar44;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar63;
  float fVar64;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar75;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [64];
  float fVar97;
  float fVar98;
  float fVar112;
  float fVar114;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar116;
  undefined1 auVar109 [16];
  float fVar113;
  float fVar115;
  undefined1 auVar110 [16];
  undefined1 auVar111 [64];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [64];
  float fVar124;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [64];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar139;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [64];
  undefined1 auVar149 [16];
  undefined1 auVar150 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  RoundLineIntersectorHitM<4> hit;
  int local_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  RTCFilterFunctionNArguments local_2c8;
  float local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  uint local_284;
  uint local_280;
  uint local_27c;
  uint local_278;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  ulong uVar31;
  undefined1 auVar138 [64];
  
  pSVar6 = context->scene;
  uVar27 = (line->v0).field_0.i[0];
  pGVar7 = (pSVar6->geometries).items[line->sharedGeomID].ptr;
  lVar32 = *(long *)&pGVar7[1].time_range.upper;
  p_Var8 = pGVar7[1].intersectionFilterN;
  auVar45 = *(undefined1 (*) [16])(lVar32 + (ulong)uVar27 * (long)p_Var8);
  uVar28 = (line->v0).field_0.i[1];
  auVar37 = *(undefined1 (*) [16])(lVar32 + (ulong)uVar28 * (long)p_Var8);
  uVar4 = (line->v0).field_0.i[2];
  auVar48 = *(undefined1 (*) [16])(lVar32 + (ulong)uVar4 * (long)p_Var8);
  uVar5 = (line->v0).field_0.i[3];
  auVar49 = *(undefined1 (*) [16])(lVar32 + (ulong)uVar5 * (long)p_Var8);
  auVar38 = vunpcklps_avx(auVar45,auVar48);
  auVar45 = vunpckhps_avx(auVar45,auVar48);
  auVar48 = vunpcklps_avx(auVar37,auVar49);
  auVar37 = vunpckhps_avx(auVar37,auVar49);
  auVar100 = vunpcklps_avx(auVar38,auVar48);
  auVar47 = vunpckhps_avx(auVar38,auVar48);
  auVar101 = vunpcklps_avx(auVar45,auVar37);
  auVar55 = vunpckhps_avx(auVar45,auVar37);
  auVar45 = *(undefined1 (*) [16])(lVar32 + (ulong)(uVar27 + 1) * (long)p_Var8);
  auVar37 = *(undefined1 (*) [16])(lVar32 + (ulong)(uVar28 + 1) * (long)p_Var8);
  auVar48 = *(undefined1 (*) [16])(lVar32 + (ulong)(uVar4 + 1) * (long)p_Var8);
  auVar49 = *(undefined1 (*) [16])(lVar32 + (ulong)(uVar5 + 1) * (long)p_Var8);
  auVar38 = vpunpckldq_avx(auVar45,auVar48);
  auVar45 = vpunpckhdq_avx(auVar45,auVar48);
  auVar48 = vpunpckldq_avx(auVar37,auVar49);
  auVar37 = vpunpckhdq_avx(auVar37,auVar49);
  auVar50 = vpunpckldq_avx(auVar38,auVar48);
  auVar48 = vpunpckhdq_avx(auVar38,auVar48);
  auVar38 = vpunpckldq_avx(auVar45,auVar37);
  auVar49 = vpunpckhdq_avx(auVar45,auVar37);
  auVar45 = vpcmpeqd_avx(auVar49,auVar49);
  auVar37 = vpcmpeqd_avx(auVar45,(undefined1  [16])(line->primIDs).field_0);
  local_b8 = vpshufd_avx(ZEXT416(line->sharedGeomID),0);
  fVar98 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar34._4_4_ = fVar98;
  auVar34._0_4_ = fVar98;
  auVar34._8_4_ = fVar98;
  auVar34._12_4_ = fVar98;
  fVar113 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar115 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar52 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar45 = ZEXT416((uint)(fVar115 * fVar115 + fVar52 * fVar52 + fVar113 * fVar113));
  auVar54 = vshufps_avx(auVar45,auVar45,0);
  auVar45 = vrcpps_avx(auVar54);
  fVar52 = auVar45._0_4_;
  auVar46._0_4_ = fVar52 * auVar54._0_4_;
  fVar60 = auVar45._4_4_;
  auVar46._4_4_ = fVar60 * auVar54._4_4_;
  fVar61 = auVar45._8_4_;
  auVar46._8_4_ = fVar61 * auVar54._8_4_;
  fVar62 = auVar45._12_4_;
  auVar46._12_4_ = fVar62 * auVar54._12_4_;
  auVar65._8_4_ = 0x3f800000;
  auVar65._0_8_ = 0x3f8000003f800000;
  auVar65._12_4_ = 0x3f800000;
  auVar45 = vsubps_avx(auVar65,auVar46);
  auVar53._0_4_ = (auVar50._0_4_ + auVar100._0_4_) * 0.5;
  auVar53._4_4_ = (auVar50._4_4_ + auVar100._4_4_) * 0.5;
  auVar53._8_4_ = (auVar50._8_4_ + auVar100._8_4_) * 0.5;
  auVar53._12_4_ = (auVar50._12_4_ + auVar100._12_4_) * 0.5;
  auVar66._0_4_ = (auVar48._0_4_ + auVar47._0_4_) * 0.5;
  auVar66._4_4_ = (auVar48._4_4_ + auVar47._4_4_) * 0.5;
  auVar66._8_4_ = (auVar48._8_4_ + auVar47._8_4_) * 0.5;
  auVar66._12_4_ = (auVar48._12_4_ + auVar47._12_4_) * 0.5;
  auVar79._0_4_ = (auVar101._0_4_ + auVar38._0_4_) * 0.5;
  auVar79._4_4_ = (auVar101._4_4_ + auVar38._4_4_) * 0.5;
  auVar79._8_4_ = (auVar101._8_4_ + auVar38._8_4_) * 0.5;
  auVar79._12_4_ = (auVar101._12_4_ + auVar38._12_4_) * 0.5;
  fVar113 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar99._4_4_ = fVar113;
  auVar99._0_4_ = fVar113;
  auVar99._8_4_ = fVar113;
  auVar99._12_4_ = fVar113;
  auVar54 = vsubps_avx(auVar66,auVar34);
  auVar34 = vsubps_avx(auVar79,auVar99);
  local_138 = (ray->super_RayK<1>).dir.field_0.m128[2];
  local_d8 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar115 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar80._4_4_ = fVar115;
  auVar80._0_4_ = fVar115;
  auVar80._8_4_ = fVar115;
  auVar80._12_4_ = fVar115;
  auVar46 = vsubps_avx(auVar53,auVar80);
  local_e8 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_258._0_4_ =
       (local_e8 * auVar46._0_4_ + local_d8 * auVar54._0_4_ + local_138 * auVar34._0_4_) *
       (fVar52 + fVar52 * auVar45._0_4_);
  local_258._4_4_ =
       (local_e8 * auVar46._4_4_ + local_d8 * auVar54._4_4_ + local_138 * auVar34._4_4_) *
       (fVar60 + fVar60 * auVar45._4_4_);
  fStack_250 = (local_e8 * auVar46._8_4_ + local_d8 * auVar54._8_4_ + local_138 * auVar34._8_4_) *
               (fVar61 + fVar61 * auVar45._8_4_);
  fStack_24c = (local_e8 * auVar46._12_4_ + local_d8 * auVar54._12_4_ + local_138 * auVar34._12_4_)
               * (fVar62 + fVar62 * auVar45._12_4_);
  auVar67._0_4_ = fVar115 + local_e8 * (float)local_258._0_4_;
  auVar67._4_4_ = fVar115 + local_e8 * (float)local_258._4_4_;
  auVar67._8_4_ = fVar115 + local_e8 * fStack_250;
  auVar67._12_4_ = fVar115 + local_e8 * fStack_24c;
  auVar149._0_4_ = fVar98 + local_d8 * (float)local_258._0_4_;
  auVar149._4_4_ = fVar98 + local_d8 * (float)local_258._4_4_;
  auVar149._8_4_ = fVar98 + local_d8 * fStack_250;
  auVar149._12_4_ = fVar98 + local_d8 * fStack_24c;
  auVar35._0_4_ = fVar113 + local_138 * (float)local_258._0_4_;
  auVar35._4_4_ = fVar113 + local_138 * (float)local_258._4_4_;
  auVar35._8_4_ = fVar113 + local_138 * fStack_250;
  auVar35._12_4_ = fVar113 + local_138 * fStack_24c;
  local_148 = vsubps_avx(auVar48,auVar47);
  local_158 = vsubps_avx(auVar38,auVar101);
  fVar98 = local_158._0_4_;
  fVar9 = local_158._4_4_;
  fVar15 = local_158._8_4_;
  fVar21 = local_158._12_4_;
  fVar113 = local_148._0_4_;
  fVar10 = local_148._4_4_;
  fVar16 = local_148._8_4_;
  fVar22 = local_148._12_4_;
  local_208 = vsubps_avx(auVar50,auVar100);
  fVar115 = local_208._0_4_;
  fVar11 = local_208._4_4_;
  fVar17 = local_208._8_4_;
  fVar23 = local_208._12_4_;
  local_268._0_4_ = fVar115 * fVar115 + fVar113 * fVar113 + fVar98 * fVar98;
  local_268._4_4_ = fVar11 * fVar11 + fVar10 * fVar10 + fVar9 * fVar9;
  fStack_260 = fVar17 * fVar17 + fVar16 * fVar16 + fVar15 * fVar15;
  fStack_25c = fVar23 * fVar23 + fVar22 * fVar22 + fVar21 * fVar21;
  local_1e8 = vsubps_avx(auVar149,auVar47);
  local_168 = vsubps_avx(auVar35,auVar101);
  fVar52 = local_168._0_4_;
  fVar12 = local_168._4_4_;
  fVar18 = local_168._8_4_;
  fVar24 = local_168._12_4_;
  fVar60 = local_1e8._0_4_;
  fVar13 = local_1e8._4_4_;
  fVar19 = local_1e8._8_4_;
  fVar25 = local_1e8._12_4_;
  local_1f8 = vsubps_avx(auVar67,auVar100);
  fVar61 = local_1f8._0_4_;
  fVar14 = local_1f8._4_4_;
  fVar20 = local_1f8._8_4_;
  fVar26 = local_1f8._12_4_;
  fVar139 = fVar115 * fVar61 + fVar113 * fVar60 + fVar98 * fVar52;
  fVar142 = fVar11 * fVar14 + fVar10 * fVar13 + fVar9 * fVar12;
  fVar143 = fVar17 * fVar20 + fVar16 * fVar19 + fVar15 * fVar18;
  fVar144 = fVar23 * fVar26 + fVar22 * fVar25 + fVar21 * fVar24;
  auVar136._0_4_ = local_e8 * fVar115 + local_d8 * fVar113 + fVar98 * local_138;
  auVar136._4_4_ = local_e8 * fVar11 + local_d8 * fVar10 + fVar9 * local_138;
  auVar136._8_4_ = local_e8 * fVar17 + local_d8 * fVar16 + fVar15 * local_138;
  auVar136._12_4_ = local_e8 * fVar23 + local_d8 * fVar22 + fVar21 * local_138;
  fStack_134 = local_138;
  fStack_130 = local_138;
  fStack_12c = local_138;
  fStack_d4 = local_d8;
  fStack_d0 = local_d8;
  fStack_cc = local_d8;
  fStack_e4 = local_e8;
  fStack_e0 = local_e8;
  fStack_dc = local_e8;
  auVar45 = vsubps_avx(auVar55,auVar49);
  fVar62 = auVar45._0_4_;
  fVar64 = auVar45._4_4_;
  fVar72 = auVar45._8_4_;
  fVar74 = auVar45._12_4_;
  fVar33 = (float)local_268._0_4_ + fVar62 * fVar62;
  fVar42 = (float)local_268._4_4_ + fVar64 * fVar64;
  fVar43 = fStack_260 + fVar72 * fVar72;
  fVar44 = fStack_25c + fVar74 * fVar74;
  local_c8._0_4_ = (float)local_268._0_4_ * (float)local_268._0_4_;
  local_c8._4_4_ = (float)local_268._4_4_ * (float)local_268._4_4_;
  fStack_c0 = fStack_260 * fStack_260;
  fStack_bc = fStack_25c * fStack_25c;
  auVar45._0_4_ =
       (float)local_c8._0_4_ * (local_e8 * fVar61 + local_d8 * fVar60 + local_138 * fVar52);
  auVar45._4_4_ =
       (float)local_c8._4_4_ * (local_e8 * fVar14 + local_d8 * fVar13 + local_138 * fVar12);
  auVar45._8_4_ = fStack_c0 * (local_e8 * fVar20 + local_d8 * fVar19 + local_138 * fVar18);
  auVar45._12_4_ = fStack_bc * (local_e8 * fVar26 + local_d8 * fVar25 + local_138 * fVar24);
  auVar100._0_4_ = fVar33 * auVar136._0_4_ * fVar139;
  auVar100._4_4_ = fVar42 * auVar136._4_4_ * fVar142;
  auVar100._8_4_ = fVar43 * auVar136._8_4_ * fVar143;
  auVar100._12_4_ = fVar44 * auVar136._12_4_ * fVar144;
  auVar45 = vsubps_avx(auVar45,auVar100);
  fVar97 = auVar55._0_4_;
  auVar101._0_4_ = (float)local_268._0_4_ * fVar97;
  fVar112 = auVar55._4_4_;
  auVar101._4_4_ = (float)local_268._4_4_ * fVar112;
  fVar114 = auVar55._8_4_;
  auVar101._8_4_ = fStack_260 * fVar114;
  fVar116 = auVar55._12_4_;
  auVar101._12_4_ = fStack_25c * fVar116;
  auVar47._0_4_ = auVar136._0_4_ * fVar62 * auVar101._0_4_ + auVar45._0_4_;
  auVar47._4_4_ = auVar136._4_4_ * fVar64 * auVar101._4_4_ + auVar45._4_4_;
  auVar47._8_4_ = auVar136._8_4_ * fVar72 * auVar101._8_4_ + auVar45._8_4_;
  auVar47._12_4_ = auVar136._12_4_ * fVar74 * auVar101._12_4_ + auVar45._12_4_;
  auVar54._0_4_ = (float)local_c8._0_4_ * (fVar61 * fVar61 + fVar60 * fVar60 + fVar52 * fVar52);
  auVar54._4_4_ = (float)local_c8._4_4_ * (fVar14 * fVar14 + fVar13 * fVar13 + fVar12 * fVar12);
  auVar54._8_4_ = fStack_c0 * (fVar20 * fVar20 + fVar19 * fVar19 + fVar18 * fVar18);
  auVar54._12_4_ = fStack_bc * (fVar26 * fVar26 + fVar25 * fVar25 + fVar24 * fVar24);
  auVar117._0_4_ = fVar139 * fVar139 * fVar33;
  auVar117._4_4_ = fVar142 * fVar142 * fVar42;
  auVar117._8_4_ = fVar143 * fVar143 * fVar43;
  auVar117._12_4_ = fVar144 * fVar144 * fVar44;
  auVar45 = vsubps_avx(auVar54,auVar117);
  auVar118._0_4_ = (fVar62 + fVar62) * fVar139;
  auVar118._4_4_ = (fVar64 + fVar64) * fVar142;
  auVar118._8_4_ = (fVar72 + fVar72) * fVar143;
  auVar118._12_4_ = (fVar74 + fVar74) * fVar144;
  auVar54 = vsubps_avx(auVar118,auVar101);
  fVar63 = auVar136._0_4_ * auVar136._0_4_;
  fVar71 = auVar136._4_4_ * auVar136._4_4_;
  fVar73 = auVar136._8_4_ * auVar136._8_4_;
  fVar75 = auVar136._12_4_ * auVar136._12_4_;
  auVar55._0_4_ = fVar33 * fVar63;
  auVar55._4_4_ = fVar42 * fVar71;
  auVar55._8_4_ = fVar43 * fVar73;
  auVar55._12_4_ = fVar44 * fVar75;
  auVar34 = vsubps_avx(_local_c8,auVar55);
  auVar102._0_4_ = auVar34._0_4_ * (auVar45._0_4_ + auVar54._0_4_ * auVar101._0_4_);
  auVar102._4_4_ = auVar34._4_4_ * (auVar45._4_4_ + auVar54._4_4_ * auVar101._4_4_);
  auVar102._8_4_ = auVar34._8_4_ * (auVar45._8_4_ + auVar54._8_4_ * auVar101._8_4_);
  auVar102._12_4_ = auVar34._12_4_ * (auVar45._12_4_ + auVar54._12_4_ * auVar101._12_4_);
  auVar119._0_4_ = auVar47._0_4_ * auVar47._0_4_;
  auVar119._4_4_ = auVar47._4_4_ * auVar47._4_4_;
  auVar119._8_4_ = auVar47._8_4_ * auVar47._8_4_;
  auVar119._12_4_ = auVar47._12_4_ * auVar47._12_4_;
  auVar54 = vsubps_avx(auVar119,auVar102);
  auVar55 = ZEXT416(0) << 0x20;
  auVar45 = vcmpps_avx(auVar54,auVar55,5);
  auVar46 = auVar45 & ~auVar37;
  if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar46[0xf] < '\0') {
    auVar46 = vandnps_avx(auVar37,auVar45);
    auVar50 = vsubps_avx(auVar67,auVar50);
    auVar100 = vsubps_avx(auVar149,auVar48);
    auVar101 = vsubps_avx(auVar35,auVar38);
    auVar45 = vrcpps_avx(auVar34);
    fVar124 = auVar45._0_4_;
    auVar131._0_4_ = fVar124 * auVar34._0_4_;
    fVar128 = auVar45._4_4_;
    auVar131._4_4_ = fVar128 * auVar34._4_4_;
    fVar129 = auVar45._8_4_;
    auVar131._8_4_ = fVar129 * auVar34._8_4_;
    fVar130 = auVar45._12_4_;
    auVar131._12_4_ = fVar130 * auVar34._12_4_;
    auVar145._8_4_ = 0x3f800000;
    auVar145._0_8_ = 0x3f8000003f800000;
    auVar145._12_4_ = 0x3f800000;
    auVar45 = vsubps_avx(auVar145,auVar131);
    fVar124 = fVar124 + fVar124 * auVar45._0_4_;
    fVar128 = fVar128 + fVar128 * auVar45._4_4_;
    fVar129 = fVar129 + fVar129 * auVar45._8_4_;
    fVar130 = fVar130 + fVar130 * auVar45._12_4_;
    auVar132._8_4_ = 0x7fffffff;
    auVar132._0_8_ = 0x7fffffff7fffffff;
    auVar132._12_4_ = 0x7fffffff;
    auVar45 = vandps_avx(auVar132,auVar34);
    auVar133._8_4_ = 0x219392ef;
    auVar133._0_8_ = 0x219392ef219392ef;
    auVar133._12_4_ = 0x219392ef;
    auVar45 = vcmpps_avx(auVar45,auVar133,2);
    auVar37 = vsqrtps_avx(auVar54);
    uVar31 = CONCAT44(auVar47._4_4_,auVar47._0_4_);
    auVar134._0_8_ = uVar31 ^ 0x8000000080000000;
    auVar134._8_4_ = -auVar47._8_4_;
    auVar134._12_4_ = -auVar47._12_4_;
    auVar48 = vsubps_avx(auVar134,auVar37);
    auVar37 = vsubps_avx(auVar37,auVar47);
    auVar103._0_4_ = auVar48._0_4_ * fVar124;
    auVar103._4_4_ = auVar48._4_4_ * fVar128;
    auVar103._8_4_ = auVar48._8_4_ * fVar129;
    auVar103._12_4_ = auVar48._12_4_ * fVar130;
    auVar48._0_4_ = fVar124 * auVar37._0_4_;
    auVar48._4_4_ = fVar128 * auVar37._4_4_;
    auVar48._8_4_ = fVar129 * auVar37._8_4_;
    auVar48._12_4_ = fVar130 * auVar37._12_4_;
    auVar36._8_4_ = 0xff800000;
    auVar36._0_8_ = 0xff800000ff800000;
    auVar36._12_4_ = 0xff800000;
    auVar37 = vblendvps_avx(auVar103,auVar36,auVar45);
    auVar76._8_4_ = 0x7f800000;
    auVar76._0_8_ = 0x7f8000007f800000;
    auVar76._12_4_ = 0x7f800000;
    auVar48 = vblendvps_avx(auVar48,auVar76,auVar45);
    auVar81._0_4_ = fVar139 + auVar136._0_4_ * auVar37._0_4_;
    auVar81._4_4_ = fVar142 + auVar136._4_4_ * auVar37._4_4_;
    auVar81._8_4_ = fVar143 + auVar136._8_4_ * auVar37._8_4_;
    auVar81._12_4_ = fVar144 + auVar136._12_4_ * auVar37._12_4_;
    auVar45 = vcmpps_avx(auVar81,auVar55,6);
    auVar38 = vcmpps_avx(auVar81,_local_268,1);
    auVar45 = vandps_avx(auVar38,auVar45);
    auVar45 = vandps_avx(auVar46,auVar45);
    local_178 = vblendvps_avx(auVar76,auVar37,auVar45);
    local_118._0_4_ = fVar139 + auVar136._0_4_ * auVar48._0_4_;
    local_118._4_4_ = fVar142 + auVar136._4_4_ * auVar48._4_4_;
    fStack_110 = fVar143 + auVar136._8_4_ * auVar48._8_4_;
    fStack_10c = fVar144 + auVar136._12_4_ * auVar48._12_4_;
    auVar45 = vcmpps_avx(_local_118,auVar55,6);
    auVar37 = vcmpps_avx(_local_118,_local_268,1);
    auVar45 = vandps_avx(auVar37,auVar45);
    auVar45 = vandps_avx(auVar46,auVar45);
    local_218 = vblendvps_avx(auVar36,auVar48,auVar45);
    auVar45 = vrcpps_avx(auVar136);
    fVar124 = auVar45._0_4_;
    auVar56._0_4_ = auVar136._0_4_ * fVar124;
    fVar128 = auVar45._4_4_;
    auVar56._4_4_ = auVar136._4_4_ * fVar128;
    fVar129 = auVar45._8_4_;
    auVar56._8_4_ = auVar136._8_4_ * fVar129;
    fVar130 = auVar45._12_4_;
    auVar56._12_4_ = auVar136._12_4_ * fVar130;
    auVar45 = vsubps_avx(auVar145,auVar56);
    fVar124 = fVar124 + fVar124 * auVar45._0_4_;
    fVar128 = fVar128 + fVar128 * auVar45._4_4_;
    fVar129 = fVar129 + fVar129 * auVar45._8_4_;
    fVar130 = fVar130 + fVar130 * auVar45._12_4_;
    auVar57._0_4_ = auVar136._0_4_ * fVar61;
    auVar57._4_4_ = auVar136._4_4_ * fVar14;
    auVar57._8_4_ = auVar136._8_4_ * fVar20;
    auVar57._12_4_ = auVar136._12_4_ * fVar26;
    auVar88._0_4_ = local_e8 * fVar139;
    auVar88._4_4_ = local_e8 * fVar142;
    auVar88._8_4_ = local_e8 * fVar143;
    auVar88._12_4_ = local_e8 * fVar144;
    auVar45 = vsubps_avx(auVar57,auVar88);
    auVar89._0_4_ = auVar136._0_4_ * fVar60;
    auVar89._4_4_ = auVar136._4_4_ * fVar13;
    auVar89._8_4_ = auVar136._8_4_ * fVar19;
    auVar89._12_4_ = auVar136._12_4_ * fVar25;
    auVar104._0_4_ = local_d8 * fVar139;
    auVar104._4_4_ = local_d8 * fVar142;
    auVar104._8_4_ = local_d8 * fVar143;
    auVar104._12_4_ = local_d8 * fVar144;
    auVar37 = vsubps_avx(auVar89,auVar104);
    auVar105._0_4_ = auVar136._0_4_ * fVar52;
    auVar105._4_4_ = auVar136._4_4_ * fVar12;
    auVar105._8_4_ = auVar136._8_4_ * fVar18;
    auVar105._12_4_ = auVar136._12_4_ * fVar24;
    auVar147._0_4_ = local_138 * fVar139;
    auVar147._4_4_ = local_138 * fVar142;
    auVar147._8_4_ = local_138 * fVar143;
    auVar147._12_4_ = local_138 * fVar144;
    auVar48 = vsubps_avx(auVar105,auVar147);
    auVar58._0_4_ =
         auVar45._0_4_ * auVar45._0_4_ +
         auVar37._0_4_ * auVar37._0_4_ + auVar48._0_4_ * auVar48._0_4_;
    auVar58._4_4_ =
         auVar45._4_4_ * auVar45._4_4_ +
         auVar37._4_4_ * auVar37._4_4_ + auVar48._4_4_ * auVar48._4_4_;
    auVar58._8_4_ =
         auVar45._8_4_ * auVar45._8_4_ +
         auVar37._8_4_ * auVar37._8_4_ + auVar48._8_4_ * auVar48._8_4_;
    auVar58._12_4_ =
         auVar45._12_4_ * auVar45._12_4_ +
         auVar37._12_4_ * auVar37._12_4_ + auVar48._12_4_ * auVar48._12_4_;
    auVar90._0_4_ = fVar63 * fVar97 * fVar97;
    auVar90._4_4_ = fVar71 * fVar112 * fVar112;
    auVar90._8_4_ = fVar73 * fVar114 * fVar114;
    auVar90._12_4_ = fVar75 * fVar116 * fVar116;
    auVar45 = vcmpps_avx(auVar58,auVar90,1);
    auVar91._0_4_ = fVar124 * -fVar139;
    auVar91._4_4_ = fVar128 * -fVar142;
    auVar91._8_4_ = fVar129 * -fVar143;
    auVar91._12_4_ = fVar130 * -fVar144;
    auVar37 = vblendvps_avx(auVar76,auVar91,auVar45);
    auVar45 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->leftExists * 0x10),
                          auVar46);
    local_2d8 = vblendvps_avx(auVar76,auVar37,auVar45);
    local_238._0_4_ = auVar50._0_4_;
    local_238._4_4_ = auVar50._4_4_;
    fStack_230 = auVar50._8_4_;
    fStack_22c = auVar50._12_4_;
    fVar139 = (float)local_238._0_4_ * fVar115 + auVar100._0_4_ * fVar113 + auVar101._0_4_ * fVar98;
    fVar142 = (float)local_238._4_4_ * fVar11 + auVar100._4_4_ * fVar10 + auVar101._4_4_ * fVar9;
    fVar143 = fStack_230 * fVar17 + auVar100._8_4_ * fVar16 + auVar101._8_4_ * fVar15;
    fVar144 = fStack_22c * fVar23 + auVar100._12_4_ * fVar22 + auVar101._12_4_ * fVar21;
    auVar92._0_4_ = auVar136._0_4_ * (float)local_238._0_4_;
    auVar92._4_4_ = auVar136._4_4_ * (float)local_238._4_4_;
    auVar92._8_4_ = auVar136._8_4_ * fStack_230;
    auVar92._12_4_ = auVar136._12_4_ * fStack_22c;
    auVar37._0_4_ = auVar136._0_4_ * auVar100._0_4_;
    auVar37._4_4_ = auVar136._4_4_ * auVar100._4_4_;
    auVar37._8_4_ = auVar136._8_4_ * auVar100._8_4_;
    auVar37._12_4_ = auVar136._12_4_ * auVar100._12_4_;
    auVar68._0_4_ = auVar136._0_4_ * auVar101._0_4_;
    auVar68._4_4_ = auVar136._4_4_ * auVar101._4_4_;
    auVar68._8_4_ = auVar136._8_4_ * auVar101._8_4_;
    auVar68._12_4_ = auVar136._12_4_ * auVar101._12_4_;
    auVar106._0_4_ = local_e8 * fVar139;
    auVar106._4_4_ = local_e8 * fVar142;
    auVar106._8_4_ = local_e8 * fVar143;
    auVar106._12_4_ = local_e8 * fVar144;
    auVar45 = vsubps_avx(auVar92,auVar106);
    auVar107._0_4_ = local_d8 * fVar139;
    auVar107._4_4_ = local_d8 * fVar142;
    auVar107._8_4_ = local_d8 * fVar143;
    auVar107._12_4_ = local_d8 * fVar144;
    auVar37 = vsubps_avx(auVar37,auVar107);
    auVar108._0_4_ = local_138 * fVar139;
    auVar108._4_4_ = local_138 * fVar142;
    auVar108._8_4_ = local_138 * fVar143;
    auVar108._12_4_ = local_138 * fVar144;
    auVar125._8_4_ = 0x3f800000;
    auVar125._0_8_ = 0x3f8000003f800000;
    auVar125._12_4_ = 0x3f800000;
    auVar48 = vsubps_avx(auVar68,auVar108);
    auVar38._0_4_ =
         auVar45._0_4_ * auVar45._0_4_ +
         auVar37._0_4_ * auVar37._0_4_ + auVar48._0_4_ * auVar48._0_4_;
    auVar38._4_4_ =
         auVar45._4_4_ * auVar45._4_4_ +
         auVar37._4_4_ * auVar37._4_4_ + auVar48._4_4_ * auVar48._4_4_;
    auVar38._8_4_ =
         auVar45._8_4_ * auVar45._8_4_ +
         auVar37._8_4_ * auVar37._8_4_ + auVar48._8_4_ * auVar48._8_4_;
    auVar38._12_4_ =
         auVar45._12_4_ * auVar45._12_4_ +
         auVar37._12_4_ * auVar37._12_4_ + auVar48._12_4_ * auVar48._12_4_;
    local_228 = auVar49._0_4_;
    fStack_224 = auVar49._4_4_;
    fStack_220 = auVar49._8_4_;
    fStack_21c = auVar49._12_4_;
    auVar69._0_4_ = fVar63 * local_228 * local_228;
    auVar69._4_4_ = fVar71 * fStack_224 * fStack_224;
    auVar69._8_4_ = fVar73 * fStack_220 * fStack_220;
    auVar69._12_4_ = fVar75 * fStack_21c * fStack_21c;
    uVar29 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar93._4_4_ = uVar29;
    auVar93._0_4_ = uVar29;
    auVar93._8_4_ = uVar29;
    auVar93._12_4_ = uVar29;
    auVar45 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->rightExists * 0x10)
                          ,auVar46);
    auVar37 = vcmpps_avx(auVar38,auVar69,1);
    auVar49._0_4_ = fVar124 * -fVar139;
    auVar49._4_4_ = fVar128 * -fVar142;
    auVar49._8_4_ = fVar129 * -fVar143;
    auVar49._12_4_ = fVar130 * -fVar144;
    auVar37 = vblendvps_avx(auVar76,auVar49,auVar37);
    auVar45 = vblendvps_avx(auVar76,auVar37,auVar45);
    auVar49 = vminps_avx(local_2d8,auVar45);
    auVar37 = vmaxps_avx(local_2d8,auVar45);
    auVar38 = vminps_avx(local_178,auVar49);
    auVar45 = vcmpps_avx(auVar76,auVar37,0);
    auVar140._8_4_ = 0xff800000;
    auVar140._0_8_ = 0xff800000ff800000;
    auVar140._12_4_ = 0xff800000;
    auVar45 = vblendvps_avx(auVar37,auVar140,auVar45);
    auVar48 = vcmpps_avx(auVar38,auVar49,0);
    auVar37 = vcmpps_avx(auVar76,auVar49,0);
    auVar37 = vblendvps_avx(auVar49,auVar140,auVar37);
    auVar45 = vblendvps_avx(auVar37,auVar45,auVar48);
    local_48 = vmaxps_avx(local_218,auVar45);
    auVar50._0_4_ = (float)local_258._0_4_ + auVar38._0_4_;
    auVar50._4_4_ = (float)local_258._4_4_ + auVar38._4_4_;
    auVar50._8_4_ = fStack_250 + auVar38._8_4_;
    auVar50._12_4_ = fStack_24c + auVar38._12_4_;
    auVar45 = vcmpps_avx(auVar93,auVar50,2);
    fVar63 = (ray->super_RayK<1>).tfar;
    auVar70._4_4_ = fVar63;
    auVar70._0_4_ = fVar63;
    auVar70._8_4_ = fVar63;
    auVar70._12_4_ = fVar63;
    auVar37 = vcmpps_avx(auVar50,auVar70,2);
    auVar45 = vandps_avx(auVar45,auVar37);
    auVar37 = vcmpps_avx(auVar76,auVar38,4);
    local_248 = vandps_avx(auVar45,auVar37);
    local_2e8._0_4_ = (float)local_258._0_4_ + local_48._0_4_;
    local_2e8._4_4_ = (float)local_258._4_4_ + local_48._4_4_;
    local_2e8._8_4_ = fStack_250 + local_48._8_4_;
    local_2e8._12_4_ = fStack_24c + local_48._12_4_;
    auVar45 = vcmpps_avx(auVar93,local_2e8,2);
    auVar37 = vcmpps_avx(local_2e8,auVar70,2);
    auVar45 = vandps_avx(auVar45,auVar37);
    auVar37 = vandps_avx(local_248,auVar46);
    auVar48 = vcmpps_avx(auVar140,local_48,4);
    auVar48 = vandps_avx(auVar46,auVar48);
    _local_238 = vandps_avx(auVar45,auVar48);
    local_2f8 = vorps_avx(auVar37,_local_238);
    if ((((local_2f8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_2f8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_2f8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_2f8[0xf] < '\0') {
      auVar48 = vblendvps_avx(local_48,auVar38,auVar37);
      auVar49 = vblendvps_avx(_local_118,auVar81,auVar37);
      auVar45 = vrcpps_avx(_local_268);
      local_228 = auVar45._0_4_;
      auVar94._0_4_ = (float)local_268._0_4_ * local_228;
      fStack_224 = auVar45._4_4_;
      auVar94._4_4_ = (float)local_268._4_4_ * fStack_224;
      fStack_220 = auVar45._8_4_;
      auVar94._8_4_ = fStack_260 * fStack_220;
      fStack_21c = auVar45._12_4_;
      auVar94._12_4_ = fStack_25c * fStack_21c;
      auVar45 = vsubps_avx(auVar125,auVar94);
      local_228 = local_228 + local_228 * auVar45._0_4_;
      fStack_224 = fStack_224 + fStack_224 * auVar45._4_4_;
      fStack_220 = fStack_220 + fStack_220 * auVar45._8_4_;
      fStack_21c = fStack_21c + fStack_21c * auVar45._12_4_;
      fVar97 = (float)local_268._0_4_ * fVar62 * fVar97;
      fVar112 = (float)local_268._4_4_ * fVar64 * fVar112;
      fVar114 = fStack_260 * fVar72 * fVar114;
      fVar116 = fStack_25c * fVar74 * fVar116;
      auVar45 = vcmpps_avx(auVar48,local_178,0);
      auVar37 = vcmpps_avx(auVar48,local_218,0);
      auVar45 = vorps_avx(auVar45,auVar37);
      auVar45 = vandps_avx(auVar46,auVar45);
      auVar37 = vcmpps_avx(local_2d8,auVar48,0);
      auVar37 = vandps_avx(auVar46,auVar37);
      fVar64 = auVar48._0_4_;
      fVar72 = auVar48._4_4_;
      fVar74 = auVar48._8_4_;
      fVar63 = auVar48._12_4_;
      fStack_124 = fVar11 * fVar112;
      local_128 = fVar115 * fVar97;
      fStack_120 = fVar17 * fVar114;
      fStack_11c = fVar23 * fVar116;
      auVar59._0_4_ = fVar115 * fVar97 + (float)local_c8._0_4_ * (fVar64 * local_e8 + fVar61);
      auVar59._4_4_ = fVar11 * fVar112 + (float)local_c8._4_4_ * (fVar72 * local_e8 + fVar14);
      auVar59._8_4_ = fVar17 * fVar114 + fStack_c0 * (fVar74 * local_e8 + fVar20);
      auVar59._12_4_ = fVar23 * fVar116 + fStack_bc * (fVar63 * local_e8 + fVar26);
      local_68 = fVar115 * fVar33;
      fStack_64 = fVar11 * fVar42;
      fStack_60 = fVar17 * fVar43;
      fStack_5c = fVar23 * fVar44;
      fVar61 = auVar49._0_4_;
      auVar120._0_4_ = fVar115 * fVar33 * fVar61;
      fVar115 = auVar49._4_4_;
      auVar120._4_4_ = fVar11 * fVar42 * fVar115;
      fVar62 = auVar49._8_4_;
      auVar120._8_4_ = fVar17 * fVar43 * fVar62;
      fVar11 = auVar49._12_4_;
      auVar120._12_4_ = fVar23 * fVar44 * fVar11;
      auVar49 = vsubps_avx(auVar59,auVar120);
      local_58 = fVar113 * fVar97;
      fStack_54 = fVar10 * fVar112;
      fStack_50 = fVar16 * fVar114;
      fStack_4c = fVar22 * fVar116;
      auVar121._0_4_ = fVar113 * fVar97 + (float)local_c8._0_4_ * (fVar64 * local_d8 + fVar60);
      auVar121._4_4_ = fVar10 * fVar112 + (float)local_c8._4_4_ * (fVar72 * local_d8 + fVar13);
      auVar121._8_4_ = fVar16 * fVar114 + fStack_c0 * (fVar74 * local_d8 + fVar19);
      auVar121._12_4_ = fVar22 * fVar116 + fStack_bc * (fVar63 * local_d8 + fVar25);
      fStack_104 = fVar10 * fVar42;
      local_108 = fVar113 * fVar33;
      fStack_100 = fVar16 * fVar43;
      fStack_fc = fVar22 * fVar44;
      auVar126._0_4_ = fVar113 * fVar33 * fVar61;
      auVar126._4_4_ = fVar10 * fVar42 * fVar115;
      auVar126._8_4_ = fVar16 * fVar43 * fVar62;
      auVar126._12_4_ = fVar22 * fVar44 * fVar11;
      auVar38 = vsubps_avx(auVar121,auVar126);
      local_88._0_8_ = local_208._0_8_ ^ 0x8000000080000000;
      local_88._8_4_ = -fVar17;
      local_88._12_4_ = -fVar23;
      auVar48 = vblendvps_avx(local_208,local_88,auVar37);
      local_1a8 = vblendvps_avx(auVar48,auVar49,auVar45);
      auVar150 = ZEXT1664(local_168);
      local_78 = fVar98 * fVar97;
      fStack_74 = fVar9 * fVar112;
      fStack_70 = fVar15 * fVar114;
      fStack_6c = fVar21 * fVar116;
      auVar77._0_4_ = fVar98 * fVar97 + (float)local_c8._0_4_ * (fVar52 + local_138 * fVar64);
      auVar77._4_4_ = fVar9 * fVar112 + (float)local_c8._4_4_ * (fVar12 + local_138 * fVar72);
      auVar77._8_4_ = fVar15 * fVar114 + fStack_c0 * (fVar18 + local_138 * fVar74);
      auVar77._12_4_ = fVar21 * fVar116 + fStack_bc * (fVar24 + local_138 * fVar63);
      local_f8 = fVar98 * fVar33;
      fStack_f4 = fVar9 * fVar42;
      fStack_f0 = fVar15 * fVar43;
      fStack_ec = fVar21 * fVar44;
      auVar109._0_4_ = fVar61 * fVar98 * fVar33;
      auVar109._4_4_ = fVar115 * fVar9 * fVar42;
      auVar109._8_4_ = fVar62 * fVar15 * fVar43;
      auVar109._12_4_ = fVar11 * fVar21 * fVar44;
      local_98._0_8_ = local_148._0_8_ ^ 0x8000000080000000;
      local_98._8_4_ = -fVar16;
      local_98._12_4_ = -fVar22;
      auVar48 = vblendvps_avx(local_148,local_98,auVar37);
      auVar49 = vsubps_avx(auVar77,auVar109);
      local_198 = vblendvps_avx(auVar48,auVar38,auVar45);
      local_a8._0_8_ = local_158._0_8_ ^ 0x8000000080000000;
      local_a8._8_4_ = -fVar15;
      local_a8._12_4_ = -fVar21;
      auVar48 = vblendvps_avx(local_158,local_a8,auVar37);
      local_188 = vblendvps_avx(auVar48,auVar49,auVar45);
      auVar39._8_4_ = 0x3f800000;
      auVar39._0_8_ = 0x3f8000003f800000;
      auVar39._12_4_ = 0x3f800000;
      _local_268 = vandnps_avx(auVar37,auVar39);
      auVar51._0_4_ = fVar61 * local_228;
      auVar51._4_4_ = fVar115 * fStack_224;
      auVar51._8_4_ = fVar62 * fStack_220;
      auVar51._12_4_ = fVar11 * fStack_21c;
      auVar137._8_4_ = 0x7f800000;
      auVar137._0_8_ = 0x7f8000007f800000;
      auVar137._12_4_ = 0x7f800000;
      auVar138 = ZEXT1664(auVar137);
      local_1d8 = vblendvps_avx(_local_268,auVar51,auVar45);
      local_1b8._0_4_ = fVar64 + (float)local_258._0_4_;
      local_1b8._4_4_ = fVar72 + (float)local_258._4_4_;
      local_1b8._8_4_ = fVar74 + fStack_250;
      local_1b8._12_4_ = fVar63 + fStack_24c;
      auVar135 = ZEXT1664(local_1b8);
      auVar1._0_4_ = (ray->super_RayK<1>).tfar;
      auVar1._4_4_ = (ray->super_RayK<1>).mask;
      auVar1._8_4_ = (ray->super_RayK<1>).id;
      auVar1._12_4_ = (ray->super_RayK<1>).flags;
      auVar87 = ZEXT1664(auVar1);
      local_1c8 = ZEXT816(0);
      auVar45 = vblendvps_avx(auVar137,local_1b8,local_2f8);
      auVar37 = vshufps_avx(auVar45,auVar45,0xb1);
      auVar37 = vminps_avx(auVar37,auVar45);
      auVar48 = vshufpd_avx(auVar37,auVar37,1);
      auVar37 = vminps_avx(auVar48,auVar37);
      local_308 = local_2f8;
      auVar37 = vcmpps_avx(auVar45,auVar37,0);
      auVar48 = local_2f8 & auVar37;
      auVar45 = vpcmpeqd_avx(auVar45,auVar45);
      auVar111 = ZEXT1664(CONCAT412(local_138,CONCAT48(local_138,CONCAT44(local_138,local_138))));
      auVar127 = ZEXT1664(local_148);
      auVar96 = ZEXT1664(local_158);
      auVar148 = ZEXT1664(local_1e8);
      auVar123 = ZEXT1664(local_1f8);
      if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar48[0xf] < '\0'
         ) {
        auVar45 = auVar37;
      }
      uVar27 = vextractps_avx(auVar1,1);
      auVar45 = vandps_avx(local_2f8,auVar45);
      uVar28 = vmovmskps_avx(auVar45);
      lVar32 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
        }
      }
      auVar78 = ZEXT1664(local_208);
      auVar146 = ZEXT1664(local_2e8);
LAB_00767ab9:
      auVar45 = local_2d8;
      auVar48 = auVar96._0_16_;
      auVar38 = auVar123._0_16_;
      auVar50 = auVar127._0_16_;
      auVar49 = auVar111._0_16_;
      auVar34 = auVar150._0_16_;
      auVar54 = auVar146._0_16_;
      auVar37 = auVar78._0_16_;
      local_280 = *(uint *)(local_b8 + lVar32 * 4);
      pRVar30 = (RTCIntersectArguments *)(ulong)local_280;
      pGVar7 = (pSVar6->geometries).items[(long)pRVar30].ptr;
      if ((pGVar7->mask & uVar27) == 0) {
        *(undefined4 *)(local_308 + lVar32 * 4) = 0;
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          auVar46 = auVar148._0_16_;
          fVar98 = *(float *)(local_1d8 + lVar32 * 4);
          fVar113 = *(float *)(local_1c8 + lVar32 * 4);
          (ray->super_RayK<1>).tfar = *(float *)(local_1b8 + lVar32 * 4);
          (ray->Ng).field_0.field_0.x = *(float *)(local_1a8 + lVar32 * 4);
          (ray->Ng).field_0.field_0.y = *(float *)(local_198 + lVar32 * 4);
          (ray->Ng).field_0.field_0.z = *(float *)(local_188 + lVar32 * 4);
          ray->u = fVar98;
          ray->v = fVar113;
          ray->primID = (line->primIDs).field_0.i[lVar32];
          ray->geomID = local_280;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
          auVar82._0_4_ = (ray->super_RayK<1>).tfar;
          auVar82._4_4_ = (ray->super_RayK<1>).mask;
          auVar82._8_4_ = (ray->super_RayK<1>).id;
          auVar82._12_4_ = (ray->super_RayK<1>).flags;
          uVar27 = vextractps_avx(auVar82,1);
          goto LAB_00767ddb;
        }
        local_2f8 = auVar135._0_16_;
        _local_258 = auVar87._0_16_;
        local_298 = *(float *)(local_1a8 + lVar32 * 4);
        local_294 = *(undefined4 *)(local_198 + lVar32 * 4);
        local_290 = *(undefined4 *)(local_188 + lVar32 * 4);
        local_28c = *(undefined4 *)(local_1d8 + lVar32 * 4);
        local_288 = *(undefined4 *)(local_1c8 + lVar32 * 4);
        local_284 = (line->primIDs).field_0.i[lVar32];
        pRVar30 = (RTCIntersectArguments *)0x0;
        local_27c = context->user->instID[0];
        local_278 = context->user->instPrimID[0];
        (ray->super_RayK<1>).tfar = *(float *)(local_1b8 + lVar32 * 4);
        local_30c = -1;
        local_2c8.valid = &local_30c;
        local_2c8.geometryUserPtr = pGVar7->userPtr;
        local_2c8.context = context->user;
        local_2c8.ray = (RTCRayN *)ray;
        local_2c8.hit = (RTCHitN *)&local_298;
        local_2c8.N = 1;
        if ((pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
           ((*pGVar7->intersectionFilterN)(&local_2c8), *local_2c8.valid != 0)) {
          pRVar30 = context->args;
          if ((pRVar30->filter != (RTCFilterFunctionN)0x0) &&
             ((((pRVar30->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)) &&
              ((*pRVar30->filter)(&local_2c8), *local_2c8.valid == 0)))) goto LAB_00767cb8;
          (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).field_0.x = *(float *)local_2c8.hit;
          (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).field_0.y =
               *(float *)(local_2c8.hit + 4);
          (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).field_0.z =
               *(float *)(local_2c8.hit + 8);
          *(float *)((long)local_2c8.ray + 0x3c) = *(float *)(local_2c8.hit + 0xc);
          *(float *)((long)local_2c8.ray + 0x40) = *(float *)(local_2c8.hit + 0x10);
          *(float *)((long)local_2c8.ray + 0x44) = *(float *)(local_2c8.hit + 0x14);
          *(float *)((long)local_2c8.ray + 0x48) = *(float *)(local_2c8.hit + 0x18);
          *(float *)((long)local_2c8.ray + 0x4c) = *(float *)(local_2c8.hit + 0x1c);
          pRVar30 = (RTCIntersectArguments *)0x0;
          *(float *)((long)local_2c8.ray + 0x50) = *(float *)(local_2c8.hit + 0x20);
        }
        else {
LAB_00767cb8:
          (ray->super_RayK<1>).tfar = (float)local_258._0_4_;
        }
        auVar45 = local_2f8;
        auVar138 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar111 = ZEXT1664(CONCAT412(fStack_12c,CONCAT48(fStack_130,CONCAT44(fStack_134,local_138))
                                     ));
        auVar146 = ZEXT1664(local_2e8);
        auVar127 = ZEXT1664(local_148);
        auVar96 = ZEXT1664(local_158);
        auVar148 = ZEXT1664(local_1e8);
        auVar150 = ZEXT1664(local_168);
        auVar123 = ZEXT1664(local_1f8);
        auVar78 = ZEXT1664(local_208);
        auVar135 = ZEXT1664(local_2f8);
        *(undefined4 *)(local_308 + lVar32 * 4) = 0;
        fVar98 = (ray->super_RayK<1>).tfar;
        auVar40._4_4_ = fVar98;
        auVar40._0_4_ = fVar98;
        auVar40._8_4_ = fVar98;
        auVar40._12_4_ = fVar98;
        auVar45 = vcmpps_avx(auVar45,auVar40,2);
        local_308 = vandps_avx(auVar45,local_308);
        auVar2._0_4_ = (ray->super_RayK<1>).tfar;
        auVar2._4_4_ = (ray->super_RayK<1>).mask;
        auVar2._8_4_ = (ray->super_RayK<1>).id;
        auVar2._12_4_ = (ray->super_RayK<1>).flags;
        auVar87 = ZEXT1664(auVar2);
        uVar27 = vextractps_avx(auVar2,1);
        auVar45 = local_2d8;
      }
      auVar48 = auVar96._0_16_;
      auVar38 = auVar123._0_16_;
      auVar50 = auVar127._0_16_;
      auVar49 = auVar111._0_16_;
      auVar34 = auVar150._0_16_;
      auVar54 = auVar146._0_16_;
      auVar37 = auVar78._0_16_;
      auVar82 = auVar87._0_16_;
      if ((((local_308 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (local_308 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (local_308 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          local_308[0xf] < '\0') {
        auVar45 = vblendvps_avx(auVar138._0_16_,auVar135._0_16_,local_308);
        auVar37 = vshufps_avx(auVar45,auVar45,0xb1);
        auVar37 = vminps_avx(auVar37,auVar45);
        auVar48 = vshufpd_avx(auVar37,auVar37,1);
        auVar37 = vminps_avx(auVar48,auVar37);
        auVar37 = vcmpps_avx(auVar45,auVar37,0);
        auVar48 = local_308 & auVar37;
        auVar45 = local_308;
        if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar48[0xf] < '\0') {
          auVar45 = vandps_avx(auVar37,local_308);
        }
        uVar29 = vmovmskps_avx(auVar45);
        uVar31 = CONCAT44((int)((ulong)pRVar30 >> 0x20),uVar29);
        lVar32 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
          }
        }
        goto LAB_00767ab9;
      }
      auVar46 = auVar148._0_16_;
LAB_00767ddb:
      auVar47 = vshufps_avx(auVar82,auVar82,0);
      auVar47 = vcmpps_avx(auVar54,auVar47,2);
      auVar47 = vandps_avx(auVar47,local_248);
      auVar55 = _local_238 & auVar47;
      if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar55[0xf] < '\0'
         ) {
        auVar87 = ZEXT1664(auVar82);
        auVar96 = ZEXT1664(auVar54);
        auVar55 = vcmpps_avx(local_48,auVar45,0);
        auVar45 = vblendvps_avx(auVar37,local_88,auVar55);
        auVar37 = vblendvps_avx(auVar50,local_98,auVar55);
        auVar48 = vblendvps_avx(auVar48,local_a8,auVar55);
        auVar50 = vcmpps_avx(local_48,local_178,0);
        auVar55 = vcmpps_avx(local_48,local_218,0);
        auVar50 = vorps_avx(auVar50,auVar55);
        fVar98 = local_48._0_4_;
        fVar113 = local_48._4_4_;
        fVar115 = local_48._8_4_;
        fVar52 = local_48._12_4_;
        auVar83._0_4_ = (float)local_c8._0_4_ * (auVar38._0_4_ + fVar98 * local_e8) + local_128;
        auVar83._4_4_ = (float)local_c8._4_4_ * (auVar38._4_4_ + fVar113 * fStack_e4) + fStack_124;
        auVar83._8_4_ = fStack_c0 * (auVar38._8_4_ + fVar115 * fStack_e0) + fStack_120;
        auVar83._12_4_ = fStack_bc * (auVar38._12_4_ + fVar52 * fStack_dc) + fStack_11c;
        auVar95._0_4_ = (float)local_c8._0_4_ * (auVar46._0_4_ + fVar98 * local_d8) + local_58;
        auVar95._4_4_ = (float)local_c8._4_4_ * (auVar46._4_4_ + fVar113 * fStack_d4) + fStack_54;
        auVar95._8_4_ = fStack_c0 * (auVar46._8_4_ + fVar115 * fStack_d0) + fStack_50;
        auVar95._12_4_ = fStack_bc * (auVar46._12_4_ + fVar52 * fStack_cc) + fStack_4c;
        auVar110._0_4_ = (float)local_c8._0_4_ * (auVar34._0_4_ + auVar49._0_4_ * fVar98) + local_78
        ;
        auVar110._4_4_ =
             (float)local_c8._4_4_ * (auVar34._4_4_ + auVar49._4_4_ * fVar113) + fStack_74;
        auVar110._8_4_ = fStack_c0 * (auVar34._8_4_ + auVar49._8_4_ * fVar115) + fStack_70;
        auVar110._12_4_ = fStack_bc * (auVar34._12_4_ + auVar49._12_4_ * fVar52) + fStack_6c;
        auVar122._0_4_ = (float)local_118._0_4_ * local_68;
        auVar122._4_4_ = (float)local_118._4_4_ * fStack_64;
        auVar122._8_4_ = fStack_110 * fStack_60;
        auVar122._12_4_ = fStack_10c * fStack_5c;
        auVar49 = vsubps_avx(auVar83,auVar122);
        local_1a8 = vblendvps_avx(auVar45,auVar49,auVar50);
        auVar84._0_4_ = (float)local_118._0_4_ * local_108;
        auVar84._4_4_ = (float)local_118._4_4_ * fStack_104;
        auVar84._8_4_ = fStack_110 * fStack_100;
        auVar84._12_4_ = fStack_10c * fStack_fc;
        auVar45 = vsubps_avx(auVar95,auVar84);
        local_198 = vblendvps_avx(auVar37,auVar45,auVar50);
        auVar85._0_4_ = (float)local_118._0_4_ * local_f8;
        auVar85._4_4_ = (float)local_118._4_4_ * fStack_f4;
        auVar85._8_4_ = fStack_110 * fStack_f0;
        auVar85._12_4_ = fStack_10c * fStack_ec;
        auVar45 = vsubps_avx(auVar110,auVar85);
        local_188 = vblendvps_avx(auVar48,auVar45,auVar50);
        auVar86._0_4_ = (float)local_118._0_4_ * local_228;
        auVar86._4_4_ = (float)local_118._4_4_ * fStack_224;
        auVar86._8_4_ = fStack_110 * fStack_220;
        auVar86._12_4_ = fStack_10c * fStack_21c;
        local_1d8 = vblendvps_avx(_local_268,auVar86,auVar50);
        auVar45 = vandps_avx(_local_238,auVar47);
        local_1c8 = ZEXT816(0) << 0x20;
        local_1b8 = auVar54;
        auVar141._8_4_ = 0x7f800000;
        auVar141._0_8_ = 0x7f8000007f800000;
        auVar141._12_4_ = 0x7f800000;
        auVar111 = ZEXT1664(auVar141);
        auVar37 = vblendvps_avx(auVar141,auVar54,auVar45);
        auVar48 = vshufps_avx(auVar37,auVar37,0xb1);
        auVar48 = vminps_avx(auVar48,auVar37);
        auVar49 = vshufpd_avx(auVar48,auVar48,1);
        auVar48 = vminps_avx(auVar49,auVar48);
        auVar37 = vcmpps_avx(auVar37,auVar48,0);
        pSVar6 = context->scene;
        local_308 = auVar45;
        auVar48 = auVar45 & auVar37;
        if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar48[0xf] < '\0') {
          auVar45 = vandps_avx(auVar37,auVar45);
        }
        uVar29 = vmovmskps_avx(auVar45);
        uVar31 = CONCAT44((int)((ulong)pRVar30 >> 0x20),uVar29);
        lVar32 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
          }
        }
        do {
          local_280 = *(uint *)(local_b8 + lVar32 * 4);
          pRVar30 = (RTCIntersectArguments *)(ulong)local_280;
          pGVar7 = (pSVar6->geometries).items[(long)pRVar30].ptr;
          if ((pGVar7->mask & uVar27) == 0) {
            *(undefined4 *)(local_308 + lVar32 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar98 = *(float *)(local_1d8 + lVar32 * 4);
              fVar113 = *(float *)(local_1c8 + lVar32 * 4);
              (ray->super_RayK<1>).tfar = *(float *)(local_1b8 + lVar32 * 4);
              (ray->Ng).field_0.field_0.x = *(float *)(local_1a8 + lVar32 * 4);
              (ray->Ng).field_0.field_0.y = *(float *)(local_198 + lVar32 * 4);
              (ray->Ng).field_0.field_0.z = *(float *)(local_188 + lVar32 * 4);
              ray->u = fVar98;
              ray->v = fVar113;
              ray->primID = (line->primIDs).field_0.i[lVar32];
              ray->geomID = local_280;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              return;
            }
            _local_258 = auVar87._0_16_;
            local_298 = *(float *)(local_1a8 + lVar32 * 4);
            local_294 = *(undefined4 *)(local_198 + lVar32 * 4);
            local_290 = *(undefined4 *)(local_188 + lVar32 * 4);
            local_28c = *(undefined4 *)(local_1d8 + lVar32 * 4);
            local_288 = *(undefined4 *)(local_1c8 + lVar32 * 4);
            local_284 = (line->primIDs).field_0.i[lVar32];
            pRVar30 = (RTCIntersectArguments *)0x0;
            local_27c = context->user->instID[0];
            local_278 = context->user->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)(local_1b8 + lVar32 * 4);
            local_30c = -1;
            local_2c8.valid = &local_30c;
            local_2c8.geometryUserPtr = pGVar7->userPtr;
            local_2c8.context = context->user;
            local_2c8.ray = (RTCRayN *)ray;
            local_2c8.hit = (RTCHitN *)&local_298;
            local_2c8.N = 1;
            if ((pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
               ((*pGVar7->intersectionFilterN)(&local_2c8), *local_2c8.valid != 0)) {
              pRVar30 = context->args;
              if ((pRVar30->filter != (RTCFilterFunctionN)0x0) &&
                 ((((pRVar30->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                    RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)) &&
                  ((*pRVar30->filter)(&local_2c8), *local_2c8.valid == 0)))) goto LAB_00768180;
              (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).field_0.x = *(float *)local_2c8.hit
              ;
              (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_2c8.hit + 4);
              (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_2c8.hit + 8);
              *(float *)((long)local_2c8.ray + 0x3c) = *(float *)(local_2c8.hit + 0xc);
              *(float *)((long)local_2c8.ray + 0x40) = *(float *)(local_2c8.hit + 0x10);
              *(float *)((long)local_2c8.ray + 0x44) = *(float *)(local_2c8.hit + 0x14);
              *(float *)((long)local_2c8.ray + 0x48) = *(float *)(local_2c8.hit + 0x18);
              *(float *)((long)local_2c8.ray + 0x4c) = *(float *)(local_2c8.hit + 0x1c);
              pRVar30 = (RTCIntersectArguments *)0x0;
              *(float *)((long)local_2c8.ray + 0x50) = *(float *)(local_2c8.hit + 0x20);
            }
            else {
LAB_00768180:
              (ray->super_RayK<1>).tfar = (float)local_258._0_4_;
            }
            auVar111 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            *(undefined4 *)(local_308 + lVar32 * 4) = 0;
            fVar98 = (ray->super_RayK<1>).tfar;
            auVar41._4_4_ = fVar98;
            auVar41._0_4_ = fVar98;
            auVar41._8_4_ = fVar98;
            auVar41._12_4_ = fVar98;
            auVar96 = ZEXT1664(local_2e8);
            auVar45 = vcmpps_avx(local_2e8,auVar41,2);
            local_308 = vandps_avx(auVar45,local_308);
            auVar3._0_4_ = (ray->super_RayK<1>).tfar;
            auVar3._4_4_ = (ray->super_RayK<1>).mask;
            auVar3._8_4_ = (ray->super_RayK<1>).id;
            auVar3._12_4_ = (ray->super_RayK<1>).flags;
            auVar87 = ZEXT1664(auVar3);
            uVar27 = vextractps_avx(auVar3,1);
          }
          if ((((local_308 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_308 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_308 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_308[0xf]) {
            return;
          }
          auVar45 = vblendvps_avx(auVar111._0_16_,auVar96._0_16_,local_308);
          auVar37 = vshufps_avx(auVar45,auVar45,0xb1);
          auVar37 = vminps_avx(auVar37,auVar45);
          auVar48 = vshufpd_avx(auVar37,auVar37,1);
          auVar37 = vminps_avx(auVar48,auVar37);
          auVar37 = vcmpps_avx(auVar45,auVar37,0);
          auVar48 = local_308 & auVar37;
          auVar45 = local_308;
          if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar48[0xf] < '\0') {
            auVar45 = vandps_avx(auVar37,local_308);
          }
          uVar29 = vmovmskps_avx(auVar45);
          uVar31 = CONCAT44((int)((ulong)pRVar30 >> 0x20),uVar29);
          lVar32 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Intersect1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }